

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singlylinkedlist.c
# Opt level: O3

SINGLYLINKEDLIST_HANDLE singlylinkedlist_create(void)

{
  SINGLYLINKEDLIST_HANDLE pSVar1;
  
  pSVar1 = (SINGLYLINKEDLIST_HANDLE)calloc(1,0x10);
  return pSVar1;
}

Assistant:

SINGLYLINKEDLIST_HANDLE singlylinkedlist_create(void)
{
    LIST_INSTANCE* result;

    /* Codes_SRS_LIST_01_001: [singlylinkedlist_create shall create a new list and return a non-NULL handle on success.] */
    result = (LIST_INSTANCE*)malloc(sizeof(LIST_INSTANCE));
    if (result != NULL)
    {
        /* Codes_SRS_LIST_01_002: [If any error occurs during the list creation, singlylinkedlist_create shall return NULL.] */
        result->head = NULL;
        result->tail = NULL;
    }

    return result;
}